

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

void __thiscall
glcts::LayoutBindingProgram::LayoutBindingProgram
          (LayoutBindingProgram *this,IProgramContextSupplier *contextSupplier)

{
  RenderContext *renderCtx;
  int iVar1;
  eStageType eVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Functions *pFVar3;
  ShaderProgram *this_00;
  undefined4 extraout_var_02;
  ProgramSources *sources;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  allocator<char> local_142;
  allocator<char> local_141;
  string local_140;
  undefined1 local_120 [40];
  ProgramSources local_f8;
  
  this->_vptr_LayoutBindingProgram = (_func_int **)&PTR__LayoutBindingProgram_01decb48;
  this->m_contextSupplier = contextSupplier;
  iVar1 = (*contextSupplier->_vptr_IProgramContextSupplier[2])(contextSupplier);
  this->m_context = *(RenderContext **)(CONCAT44(extraout_var,iVar1) + 8);
  eVar2 = (*contextSupplier->_vptr_IProgramContextSupplier[4])(contextSupplier);
  this->m_stage = eVar2;
  iVar1 = (*contextSupplier->_vptr_IProgramContextSupplier[3])(contextSupplier);
  this->m_testParams = (LayoutBindingParameters *)CONCAT44(extraout_var_00,iVar1);
  iVar1 = (*contextSupplier->_vptr_IProgramContextSupplier[2])(contextSupplier);
  pFVar3 = (Functions *)(**(code **)(**(long **)(CONCAT44(extraout_var_01,iVar1) + 8) + 0x18))();
  this->m_gl = pFVar3;
  iVar1 = (*this->_vptr_LayoutBindingProgram[2])(this);
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = this->m_context;
  if (iVar1 == 2) {
    memset(&local_f8,0,0xac);
    local_f8.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_f8.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    local_f8.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_f8._193_8_ = 0;
    iVar1 = (*this->m_contextSupplier->_vptr_IProgramContextSupplier[5])(this->m_contextSupplier,2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,*(char **)CONCAT44(extraout_var_02,iVar1),&local_142);
    glu::ComputeSource::ComputeSource((ComputeSource *)local_120,&local_140);
    sources = glu::ProgramSources::operator<<(&local_f8,(ShaderSource *)local_120);
    glu::ShaderProgram::ShaderProgram(this_00,renderCtx,sources);
    this->m_program = this_00;
    std::__cxx11::string::~string((string *)(local_120 + 8));
    std::__cxx11::string::~string((string *)&local_140);
    glu::ProgramSources::~ProgramSources(&local_f8);
  }
  else {
    iVar1 = (*this->m_contextSupplier->_vptr_IProgramContextSupplier[5])(this->m_contextSupplier,0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_120,*(char **)CONCAT44(extraout_var_03,iVar1),&local_142);
    iVar1 = (*this->m_contextSupplier->_vptr_IProgramContextSupplier[5])(this->m_contextSupplier,1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,*(char **)CONCAT44(extraout_var_04,iVar1),&local_141);
    glu::makeVtxFragSources(&local_f8,(string *)local_120,&local_140);
    glu::ShaderProgram::ShaderProgram(this_00,renderCtx,&local_f8);
    this->m_program = this_00;
    glu::ProgramSources::~ProgramSources(&local_f8);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)local_120);
  }
  return;
}

Assistant:

LayoutBindingProgram(IProgramContextSupplier& contextSupplier)
		: m_contextSupplier(contextSupplier)
		, m_context(contextSupplier.getContext().getRenderContext())
		, m_stage(contextSupplier.getStage())
		, m_testParams(contextSupplier.getTestParameters())
		, m_gl(contextSupplier.getContext().getRenderContext().getFunctions())
	{
		if (getStage() != ComputeShader)
			m_program = new glu::ShaderProgram(
				m_context, glu::makeVtxFragSources(m_contextSupplier.getSource(VertexShader).c_str(),
												   m_contextSupplier.getSource(FragmentShader).c_str()));
		else
			m_program = new glu::ShaderProgram(
				m_context,
				glu::ProgramSources() << glu::ComputeSource(m_contextSupplier.getSource(ComputeShader).c_str()));
	}